

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

bool __thiscall
ON_ObjRefEvaluationParameter::Write(ON_ObjRefEvaluationParameter *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool local_21;
  bool rc;
  ON_BinaryArchive *archive_local;
  ON_ObjRefEvaluationParameter *this_local;
  
  this_local._7_1_ = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (this_local._7_1_) {
    local_21 = ON_BinaryArchive::WriteInt(archive,this->m_t_type);
    if ((((local_21) &&
         (local_21 = ON_BinaryArchive::WriteComponentIndex(archive,&this->m_t_ci), local_21)) &&
        (local_21 = ON_BinaryArchive::WriteDouble(archive,4,this->m_t), local_21)) &&
       ((local_21 = ON_BinaryArchive::WriteInterval(archive,(ON_Interval *)&this->field_0x28),
        local_21 &&
        (local_21 = ON_BinaryArchive::WriteInterval(archive,(ON_Interval *)&this->field_0x38),
        local_21)))) {
      local_21 = ON_BinaryArchive::WriteInterval(archive,(ON_Interval *)&this->field_0x48);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    if (!bVar1) {
      local_21 = false;
    }
    this_local._7_1_ = local_21;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ObjRefEvaluationParameter::Write( ON_BinaryArchive& archive ) const
{
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
  if (!rc)
    return rc;

  for(;;)
  {
    rc = archive.WriteInt(m_t_type);
    if (!rc) break;

    rc = archive.WriteComponentIndex(m_t_ci);
    if (!rc) break;

    rc = archive.WriteDouble(4,m_t);
    if (!rc) break;

    rc = archive.WriteInterval(m_s[0]);
    if (!rc) break;

    rc = archive.WriteInterval(m_s[1]);
    if (!rc) break;

    rc = archive.WriteInterval(m_s[2]);
    if (!rc) break;

    break;
  }

  if ( !archive.EndWrite3dmChunk() )
    rc = false;

  return rc;
}